

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

Uint32 __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetStaticVariableCount
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderType)

{
  Uint32 UVar1;
  PipelineResourceSignatureImplType *this_00;
  string _msg;
  _Alloc_hider in_stack_ffffffffffffffc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  Char *local_18;
  
  CheckPipelineReady(this);
  if (this->m_UsingImplicitSignature == false) {
    FormatString<char[171]>
              ((string *)&stack0xffffffffffffffc8,
               (char (*) [171])
               "IPipelineState::GetStaticVariableCount is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::GetStaticVariableCount instead."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,in_stack_ffffffffffffffc8._M_p,0,0,0);
    }
  }
  else {
    if ((this->m_ActiveShaderStages & ShaderType) != SHADER_TYPE_UNKNOWN) {
      this_00 = GetResourceSignature(this,0);
      UVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetStaticVariableCount
                        (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                         ,ShaderType);
      return UVar1;
    }
    local_18 = GetShaderTypeLiteralName(ShaderType);
    FormatString<char[62],char_const*,char[35],char_const*,char[3]>
              ((string *)&stack0xffffffffffffffc8,
               (Diligent *)"Unable to get the number of static variables in shader stage ",
               (char (*) [62])&local_18,(char **)" as the stage is inactive in PSO \'",
               (char (*) [35])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                ).m_Desc,(char **)"\'.",(char (*) [3])in_stack_ffffffffffffffc8._M_p);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,in_stack_ffffffffffffffc8._M_p,0,0,0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffffc8._M_p != &local_28) {
    operator_delete(in_stack_ffffffffffffffc8._M_p,local_28._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

GetStaticVariableCount(SHADER_TYPE ShaderType) const override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::GetStaticVariableCount is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::GetStaticVariableCount instead.");
            return 0;
        }

        if ((m_ActiveShaderStages & ShaderType) == 0)
        {
            LOG_WARNING_MESSAGE("Unable to get the number of static variables in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is inactive in PSO '", this->m_Desc.Name, "'.");
            return 0;
        }

        return this->GetResourceSignature(0)->GetStaticVariableCount(ShaderType);
    }